

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

drmModePropertyPtr __thiscall
QKmsDevice::connectorProperty(QKmsDevice *this,drmModeConnectorPtr connector,QByteArray *name)

{
  int iVar1;
  drmModePropertyPtr p_Var2;
  char *__s2;
  long in_RSI;
  long in_RDI;
  int i;
  drmModePropertyPtr prop;
  int local_2c;
  
  local_2c = 0;
  do {
    if (*(int *)(in_RSI + 0x30) <= local_2c) {
      return (drmModePropertyPtr)0x0;
    }
    p_Var2 = (drmModePropertyPtr)
             drmModeGetProperty(*(undefined4 *)(in_RDI + 0x28),
                                *(undefined4 *)(*(long *)(in_RSI + 0x38) + (long)local_2c * 4));
    if (p_Var2 != (drmModePropertyPtr)0x0) {
      __s2 = QByteArray::constData((QByteArray *)0x11554b);
      iVar1 = strcmp(p_Var2->name,__s2);
      if (iVar1 == 0) {
        return p_Var2;
      }
      drmModeFreeProperty(p_Var2);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

drmModePropertyPtr QKmsDevice::connectorProperty(drmModeConnectorPtr connector, const QByteArray &name)
{
    drmModePropertyPtr prop;

    for (int i = 0; i < connector->count_props; i++) {
        prop = drmModeGetProperty(m_dri_fd, connector->props[i]);
        if (!prop)
            continue;
        if (strcmp(prop->name, name.constData()) == 0)
            return prop;
        drmModeFreeProperty(prop);
    }

    return nullptr;
}